

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int amqpvalue_get_binary(AMQP_VALUE value,amqp_binary *binary_value)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || binary_value == (amqp_binary *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x40c;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_binary",0x40b,1,"Bad arguments: value = %p, binary_value = %p",value
                ,binary_value);
    }
  }
  else if (value->type == AMQP_TYPE_BINARY) {
    binary_value->length = (value->value).binary_value.length;
    binary_value->bytes = (value->value).described_value.descriptor;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x415;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_binary",0x414,1,"Value is not of type BINARY");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_binary(AMQP_VALUE value, amqp_binary* binary_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_132: [If any of the arguments is NULL then amqpvalue_get_binary shall return NULL.] */
    if ((value == NULL) ||
        (binary_value == NULL))
    {
        LogError("Bad arguments: value = %p, binary_value = %p",
            value, binary_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_133: [If the type of the value is not binary (was not created with amqpvalue_create_binary), then amqpvalue_get_binary shall return NULL.] */
        if (value_data->type != AMQP_TYPE_BINARY)
        {
            LogError("Value is not of type BINARY");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_131: [amqpvalue_get_binary shall yield a pointer to the sequence of bytes held by the AMQP_VALUE in binary_value.data and fill in the binary_value.length argument the number of bytes held in the binary value.] */
            binary_value->length = value_data->value.binary_value.length;
            binary_value->bytes = value_data->value.binary_value.bytes;

            result = 0;
        }
    }

    return result;
}